

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

void __thiscall
sjtu::LRUCache<sjtu::TrainManager::stationNameType>::~LRUCache
          (LRUCache<sjtu::TrainManager::stationNameType> *this)

{
  ostream *poVar1;
  void *pvVar2;
  long in_RDI;
  longdouble lVar3;
  undefined2 uVar4;
  undefined6 in_stack_ffffffffffffff92;
  CacheNode *in_stack_ffffffffffffffa0;
  
  while (*(long *)(in_RDI + 0x18) != 0) {
    *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x48);
    pvVar2 = *(void **)(in_RDI + 0x18);
    if (pvVar2 != (void *)0x0) {
      CacheNode::~CacheNode(in_stack_ffffffffffffffa0);
      operator_delete(pvVar2,0x58);
    }
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x20);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Attempt count: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Miss count: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x14));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Miss rate: ");
  lVar3 = (longdouble)100.0 *
          ((longdouble)*(uint *)(in_RDI + 0x14) / (longdouble)*(uint *)(in_RDI + 0x10));
  uVar4 = (undefined2)((unkuint10)lVar3 >> 0x40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar3);
  poVar1 = std::operator<<(poVar1,"%");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::
  ~map((map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
        *)CONCAT62(in_stack_ffffffffffffff92,uVar4));
  return;
}

Assistant:

~LRUCache()
		{
			for (;head;head = tail) tail = head -> succ , delete head;
			std::cerr << "Attempt count: " << attempt_count << std::endl;
			std::cerr << "Miss count: " << miss_count << std::endl;
			std::cerr << "Miss rate: " << static_cast<long double> (miss_count) / attempt_count * 100 << "%" << std::endl;
		}